

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O2

void __thiscall ADSBHubConnection::ProcessPlaneData(ADSBHubConnection *this)

{
  FDKeyTy *__k;
  double dVar1;
  bool bVar2;
  mapped_type *this_00;
  long lVar3;
  positionTy *ppVar4;
  FDDynamicData *pFVar5;
  byte bVar6;
  unique_lock<std::mutex> mapFdLock;
  positionTy viewPos;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined8 local_108;
  int local_100;
  bool local_fc;
  Doc8643 *local_f8;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  pointer local_d0;
  pointer pbStack_c8;
  pointer local_c0;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  bVar6 = 0;
  if (NAN((this->pos)._ts)) {
    dVar1 = GetSysTime();
    (this->pos)._ts = dVar1 + -3.0;
    (this->dyn).ts = dVar1 + -3.0;
  }
  __k = &this->fdKey;
  if ((this->fdKey).key._M_string_length != 0) {
    ppVar4 = &this->pos;
    bVar2 = positionTy::isNormal(ppVar4,true);
    if (bVar2) {
      DataRefs::GetViewPos();
      dVar1 = CoordDistance(ppVar4,&viewPos);
      if (dVar1 < (double)(dataRefs.fdStdDistance * 0x73c)) {
        std::unique_lock<std::mutex>::unique_lock(&mapFdLock,&mapFdMutex);
        this_00 = std::
                  map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                  ::operator[](&mapFd,__k);
        std::recursive_mutex::lock(&this_00->dataAccessMutex);
        std::unique_lock<std::mutex>::unlock(&mapFdLock);
        if ((this_00->acKey).key._M_string_length == 0) {
          LTFlightData::SetKey(this_00,__k);
        }
        LTFlightData::UpdateData(this_00,&this->stat,dVar1,DATREQU_NONE);
        (this->dyn).pChannel = (LTChannel *)this;
        LTFlightData::AddDynData(this_00,&this->dyn,0,0,ppVar4);
        pthread_mutex_unlock((pthread_mutex_t *)&this_00->dataAccessMutex);
        std::unique_lock<std::mutex>::~unique_lock(&mapFdLock);
      }
    }
  }
  LTFlightData::FDKeyTy::clear(__k);
  viewPos._lat = (double)&viewPos._alt;
  viewPos._lon = 0.0;
  viewPos._alt._0_1_ = 0;
  viewPos._head = (double)&viewPos._roll;
  viewPos._pitch = 0.0;
  viewPos._roll._0_1_ = 0;
  viewPos.edgeIdx = (size_t)&local_178;
  local_178._M_local_buf[0] = '\0';
  local_168._M_p = (pointer)&local_158;
  local_160 = 0;
  local_158._M_local_buf[0] = '\0';
  local_148._M_p = (pointer)&local_138;
  local_140 = 0;
  local_138._M_local_buf[0] = '\0';
  local_128._M_p = (pointer)&local_118;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_108._0_4_ = -1;
  local_108._4_4_ = -1;
  local_100 = 0;
  local_fc = false;
  local_f8 = (Doc8643 *)0x0;
  local_f0._M_p = (pointer)&local_e0;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  local_d0 = (pointer)0x0;
  pbStack_c8 = (pointer)0x0;
  local_c0 = (pointer)0x0;
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98._M_p = (pointer)&local_88;
  local_90 = 0;
  local_88._M_local_buf[0] = '\0';
  local_78._M_p = (pointer)&local_68;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_58._M_p = (pointer)&local_48;
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_38._0_1_ = false;
  local_38._1_1_ = false;
  LTFlightData::FDStaticData::operator=(&this->stat,(FDStaticData *)&viewPos);
  LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)&viewPos);
  LTFlightData::FDDynamicData::FDDynamicData((FDDynamicData *)&viewPos);
  ppVar4 = &viewPos;
  pFVar5 = &this->dyn;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pFVar5->radar).size = ((XPMPPlaneRadar_t *)&ppVar4->_lat)->size;
    ppVar4 = (positionTy *)((long)ppVar4 + (ulong)bVar6 * -0x10 + 8);
    pFVar5 = (FDDynamicData *)((long)pFVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  (this->pos)._lat = NAN;
  (this->pos)._lon = NAN;
  (this->pos)._alt = NAN;
  (this->pos)._ts = NAN;
  (this->pos)._head = NAN;
  (this->pos)._pitch = NAN;
  (this->pos)._roll = NAN;
  (this->pos).mergeCount = 1;
  (this->pos).f = (posFlagsTy)0x0;
  (this->pos).edgeIdx = 0xffffffffffffffff;
  return;
}

Assistant:

void ADSBHubConnection::ProcessPlaneData ()
{
    // if no timestamp then assume "3s ago"
    if (std::isnan(pos.ts()))
        dyn.ts = pos.ts() = GetSysTime() - 3.0;

    // Data collected?
    if (!fdKey.empty() && pos.isNormal(true))
    {
        // ADSBHub always sends _all_ data,
        // Filter data that the user doesn't want based on settings
        const positionTy viewPos = dataRefs.GetViewPos();
        const double dist = pos.dist(viewPos);
        if (dist < dataRefs.GetFdStdDistance_m() )
        {
            try {
                // from here on access to fdMap guarded by a mutex
                // until FD object is inserted and updated
                std::unique_lock<std::mutex> mapFdLock (mapFdMutex);

                // get the fd object from the map, key is the transpIcao
                // this fetches an existing or, if not existing, creates a new one
                LTFlightData& fd = mapFd[fdKey];
                
                // also get the data access lock once and for all
                // so following fetch/update calls only make quick recursive calls
                std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
                // now that we have the detail lock we can release the global one
                mapFdLock.unlock();

                // completely new? fill key fields
                if ( fd.empty() )
                    fd.SetKey(fdKey);
                
                // add the static data
                fd.UpdateData(stat, dist);

                // add the dynamic data
                dyn.pChannel = this;
                fd.AddDynData(dyn, 0, 0, &pos);

            } catch(const std::system_error& e) {
                LOG_MSG(logERR, ERR_LOCK_ERROR, "mapFd", e.what());
            }
        }
    }

    // Clear processed data
    fdKey.clear();
    stat = LTFlightData::FDStaticData();
    dyn = LTFlightData::FDDynamicData();
    pos = positionTy();
}